

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O0

int ffpprujj(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,ULONGLONG *array,
            int *status)

{
  int iVar1;
  int *in_R9;
  unsigned_long nullvalue;
  long row;
  ULONGLONG *in_stack_00007230;
  LONGLONG in_stack_00007238;
  LONGLONG in_stack_00007240;
  LONGLONG in_stack_00007248;
  int in_stack_00007254;
  fitsfile *in_stack_00007258;
  int *in_stack_000072a0;
  fitsfile *in_stack_ffffffffffffffa8;
  int local_4;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffffa8,(int *)0x228eb1);
  if (iVar1 == 0) {
    ffpclujj(in_stack_00007258,in_stack_00007254,in_stack_00007248,in_stack_00007240,
             in_stack_00007238,in_stack_00007230,in_stack_000072a0);
    local_4 = *in_R9;
  }
  else {
    ffpmsg((char *)0x228ec2);
    *in_R9 = 0x19d;
    local_4 = 0x19d;
  }
  return local_4;
}

Assistant:

int ffpprujj( fitsfile *fptr,  /* I - FITS file pointer                       */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            ULONGLONG *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
*/
{
    long row;
    unsigned long nullvalue;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing TULONGLONG to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    row=maxvalue(1,group);

    ffpclujj(fptr, 2, row, firstelem, nelem, array, status);
    return(*status);
}